

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMT_SYM_DEF_OBJECT_Unmarshal
                 (TPMT_SYM_DEF_OBJECT *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPM_RC result;
  BOOL flag_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMT_SYM_DEF_OBJECT *target_local;
  
  target_local._4_4_ = TPMI_ALG_SYM_OBJECT_Unmarshal(&target->algorithm,buffer,size,flag);
  if ((target_local._4_4_ == 0) &&
     (target_local._4_4_ =
           TPMU_SYM_KEY_BITS_Unmarshal(&target->keyBits,buffer,size,(uint)target->algorithm),
     target_local._4_4_ == 0)) {
    target_local._4_4_ = TPMU_SYM_MODE_Unmarshal(&target->mode,buffer,size,(uint)target->algorithm);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMT_SYM_DEF_OBJECT_Unmarshal(TPMT_SYM_DEF_OBJECT *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPMI_ALG_SYM_OBJECT_Unmarshal((TPMI_ALG_SYM_OBJECT *)&(target->algorithm), buffer, size, flag);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_SYM_KEY_BITS_Unmarshal((TPMU_SYM_KEY_BITS *)&(target->keyBits), buffer, size, (UINT32)target->algorithm);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_SYM_MODE_Unmarshal((TPMU_SYM_MODE *)&(target->mode), buffer, size, (UINT32)target->algorithm);
    return result;
}